

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O1

void progress_finalize(per_transfer *per)

{
  all_dlalready = all_dlalready + per->dlnow;
  all_ulalready = all_ulalready + per->ulnow;
  if ((per->field_0x1c0 & 1) == 0) {
    all_dltotal = all_dltotal + per->dltotal;
    per->field_0x1c0 = per->field_0x1c0 | 1;
  }
  if ((per->field_0x1c0 & 2) == 0) {
    all_ultotal = all_ultotal + per->ultotal;
    per->field_0x1c0 = per->field_0x1c0 | 2;
  }
  return;
}

Assistant:

void progress_finalize(struct per_transfer *per)
{
  /* get the numbers before this transfer goes away */
  all_dlalready += per->dlnow;
  all_ulalready += per->ulnow;
  if(!per->dltotal_added) {
    all_dltotal += per->dltotal;
    per->dltotal_added = TRUE;
  }
  if(!per->ultotal_added) {
    all_ultotal += per->ultotal;
    per->ultotal_added = TRUE;
  }
}